

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::CheckboxFlagsT<unsigned_int>(char *label,uint *flags,uint flags_value)

{
  ImGuiItemFlags *pIVar1;
  bool bVar2;
  uint uVar3;
  bool all_on;
  bool local_11;
  
  local_11 = (*flags & flags_value) == flags_value;
  if (!local_11 && (*flags & flags_value) != 0) {
    pIVar1 = &(GImGui->NextItemData).ItemFlags;
    *pIVar1 = *pIVar1 | 0x1000;
  }
  bVar2 = Checkbox(label,&local_11);
  if (bVar2) {
    if (local_11 == true) {
      uVar3 = flags_value | *flags;
    }
    else {
      uVar3 = ~flags_value & *flags;
    }
    *flags = uVar3;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::CheckboxFlagsT(const char* label, T* flags, T flags_value)
{
    bool all_on = (*flags & flags_value) == flags_value;
    bool any_on = (*flags & flags_value) != 0;
    bool pressed;
    if (!all_on && any_on)
    {
        ImGuiContext& g = *GImGui;
        g.NextItemData.ItemFlags |= ImGuiItemFlags_MixedValue;
        pressed = Checkbox(label, &all_on);
    }
    else
    {
        pressed = Checkbox(label, &all_on);

    }
    if (pressed)
    {
        if (all_on)
            *flags |= flags_value;
        else
            *flags &= ~flags_value;
    }
    return pressed;
}